

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ORA_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  bVar1 = bVar1 | this->A;
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::ORA_AB()
{
    cycles = 4;
    A |= ReadByte(GetWord());
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}